

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::SetPropertyWithAttributes
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  code *pcVar1;
  DynamicType *typeHandler_00;
  byte attributes_00;
  uint propertyKey;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  PathTypeHandlerBase *pPVar5;
  JavascriptLibrary *pJVar6;
  undefined4 *puVar7;
  ScriptContext *pSVar8;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  uint32 local_74;
  ScriptContext *pSStack_70;
  uint32 indexVal;
  ScriptContext *scriptContext;
  Type local_60;
  JavascriptLibrary *library;
  DynamicType *oldType;
  SimpleTypeHandler<2UL> *typeHandler;
  Type TStack_40;
  PropertyIndex index;
  PropertyValueInfo *info_local;
  Type TStack_30;
  PropertyAttributes attributes_local;
  Var value_local;
  Type TStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<2UL> *this_local;
  
  TStack_40.ptr = (RuntimeFunction *)info;
  info_local._7_1_ = attributes;
  TStack_30.ptr = (RuntimeFunction *)value;
  value_local._4_4_ = propertyId;
  TStack_20.ptr = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)this;
  BVar3 = GetDescriptor(this,propertyId,(PropertyIndex *)((long)&typeHandler + 6));
  if (BVar3 == 0) {
    pSStack_70 = RecyclableObject::GetScriptContext((RecyclableObject *)TStack_20.ptr);
    BVar3 = ScriptContext::IsNumericPropertyId(pSStack_70,value_local._4_4_,&local_74);
    if (BVar3 == 0) {
      this_local._4_4_ =
           AddProperty(this,(DynamicObject *)TStack_20.ptr,value_local._4_4_,TStack_30.ptr,
                       info_local._7_1_,(PropertyValueInfo *)TStack_40.ptr,flags,possibleSideEffects
                      );
    }
    else {
      this_local._4_4_ =
           DynamicTypeHandler::SetItemWithAttributes
                     (&this->super_DynamicTypeHandler,(DynamicObject *)TStack_20.ptr,local_74,
                      TStack_30.ptr,info_local._7_1_);
    }
  }
  else {
    if (this->descriptors[typeHandler._6_2_].field_1.Attributes != info_local._7_1_) {
      oldType = (DynamicType *)this;
      bVar2 = DynamicTypeHandler::GetIsLocked(&this->super_DynamicTypeHandler);
      if (bVar2) {
        library = (JavascriptLibrary *)DynamicObject::GetDynamicType((DynamicObject *)TStack_20.ptr)
        ;
        bVar2 = DoConvertToPathType((DynamicType *)library);
        if (bVar2) {
          pPVar5 = ConvertToPathType(this,(DynamicObject *)TStack_20.ptr);
          iVar4 = (*(pPVar5->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                            (pPVar5,TStack_20.ptr,(ulong)value_local._4_4_,TStack_30.ptr,
                             (ulong)info_local._7_1_,TStack_40.ptr,flags,(uint)possibleSideEffects);
          return iVar4;
        }
        oldType = (DynamicType *)ConvertToNonSharedSimpleType(this,(DynamicObject *)TStack_20.ptr);
        bVar2 = DynamicType::GetIsLocked((DynamicType *)library);
        if ((bVar2) &&
           (pJVar6 = (JavascriptLibrary *)
                     DynamicObject::GetDynamicType((DynamicObject *)TStack_20.ptr),
           pJVar6 == library)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                      ,0x3fb,
                                      "(!oldType->GetIsLocked() || instance->GetDynamicType() != oldType)"
                                      ,
                                      "!oldType->GetIsLocked() || instance->GetDynamicType() != oldType"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
      }
      if ((this->descriptors[typeHandler._6_2_].field_1.Attributes & 8) != 0) {
        pSVar8 = RecyclableObject::GetScriptContext((RecyclableObject *)TStack_20.ptr);
        ScriptContext::InvalidateProtoCaches(pSVar8,value_local._4_4_);
      }
      *(byte *)&(&oldType->typeHandler)[(ulong)typeHandler._6_2_ * 2].ptr = info_local._7_1_;
      if ((info_local._7_1_ & 1) != 0) {
        DynamicObject::SetHasNoEnumerableProperties((DynamicObject *)TStack_20.ptr,false);
      }
      local_60.ptr = (GlobalObject *)RecyclableObject::GetLibrary((RecyclableObject *)TStack_20.ptr)
      ;
      JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
                ((JavascriptLibrary *)&scriptContext);
      this_00 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
                operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                            *)&scriptContext);
      propertyKey = value_local._4_4_;
      attributes_00 = info_local._7_1_;
      typeHandler_00 = oldType;
      pSVar8 = JavascriptLibrary::GetScriptContext((JavascriptLibrary *)local_60.ptr);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
                (this_00,(DynamicTypeHandler *)typeHandler_00,attributes_00,propertyKey,pSVar8);
    }
    DynamicTypeHandler::SetSlotUnchecked
              ((DynamicObject *)TStack_20.ptr,(uint)typeHandler._6_2_,TStack_30.ptr);
    PropertyValueInfo::Set
              ((PropertyValueInfo *)TStack_40.ptr,(RecyclableObject *)TStack_20.ptr,
               typeHandler._6_2_,this->descriptors[typeHandler._6_2_].field_1.Attributes,
               InlineCacheNoFlags);
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,(DynamicObject *)TStack_20.ptr,value_local._4_4_,
               TStack_30.ptr,possibleSideEffects);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        PropertyIndex index;
        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes != attributes)
            {
                SimpleTypeHandler * typeHandler = this;
                if (GetIsLocked())
                {
                    DynamicType* oldType = instance->GetDynamicType();
                    if (DoConvertToPathType(oldType))
                    {
                        return this->ConvertToPathType(instance)->SetPropertyWithAttributes(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
                    }
                    else
                    {
                        // Don't attempt to share cross-site function types
                        typeHandler = this->ConvertToNonSharedSimpleType(instance);
                    }
                    Assert(!oldType->GetIsLocked() || instance->GetDynamicType() != oldType);
                }
                if (descriptors[index].Attributes & PropertyDeleted)
                {
                    instance->GetScriptContext()->InvalidateProtoCaches(propertyId);
                }
                typeHandler->descriptors[index].Attributes = attributes;
                if (attributes & PropertyEnumerable)
                {
                    instance->SetHasNoEnumerableProperties(false);
                }
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(typeHandler, attributes, propertyId, library->GetScriptContext());
            }
            SetSlotUnchecked(instance, index, value);
            PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(index), descriptors[index].Attributes);
            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyId. May create objectArray.
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::SetItemWithAttributes(instance, indexVal, value, attributes);
        }

        return this->AddProperty(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
    }